

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint preProcessScanlines(uchar **out,size_t *outsize,uchar *in,uint w,uint h,LodePNGInfo *info_png,
                        LodePNGEncoderSettings *settings)

{
  uint bpp_00;
  uchar *puVar1;
  uchar *out_00;
  uchar *padded_1;
  uint i;
  uchar *adam7;
  size_t passstart [8];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  uint passh [7];
  uint passw [7];
  uchar *padded;
  uint error;
  uint bpp;
  LodePNGInfo *info_png_local;
  uint h_local;
  uint w_local;
  uchar *in_local;
  size_t *outsize_local;
  uchar **out_local;
  
  bpp_00 = lodepng_get_bpp(&info_png->color);
  padded._0_4_ = 0;
  if (info_png->interlace_method == 0) {
    *outsize = (ulong)(h + h * (w * bpp_00 + 7 >> 3));
    puVar1 = (uchar *)lodepng_malloc(*outsize);
    *out = puVar1;
    if ((*out == (uchar *)0x0) && (*outsize != 0)) {
      padded._0_4_ = 0x53;
    }
    if ((uint)padded == 0) {
      if ((bpp_00 < 8) && (w * bpp_00 != (w * bpp_00 + 7 & 0xfffffff8))) {
        puVar1 = (uchar *)lodepng_malloc((ulong)(h * (w * bpp_00 + 7 >> 3)));
        if (puVar1 == (uchar *)0x0) {
          padded._0_4_ = 0x53;
        }
        if ((uint)padded == 0) {
          addPaddingBits(puVar1,in,(ulong)(w * bpp_00 + 7 & 0xfffffff8),(ulong)(w * bpp_00),h);
          padded._0_4_ = filter(*out,puVar1,w,h,&info_png->color,settings);
        }
        lodepng_free(puVar1);
      }
      else {
        padded._0_4_ = filter(*out,in,w,h,&info_png->color,settings);
      }
    }
  }
  else {
    Adam7_getpassvalues(passh + 6,(uint *)(filter_passstart + 7),padded_passstart + 7,passstart + 7,
                        (size_t *)&adam7,w,h,bpp_00);
    *outsize = filter_passstart[6];
    puVar1 = (uchar *)lodepng_malloc(*outsize);
    *out = puVar1;
    if (*out == (uchar *)0x0) {
      padded._0_4_ = 0x53;
    }
    puVar1 = (uchar *)lodepng_malloc(passstart[6]);
    if ((puVar1 == (uchar *)0x0) && (passstart[6] != 0)) {
      padded._0_4_ = 0x53;
    }
    if ((uint)padded == 0) {
      Adam7_interlace(puVar1,in,w,h,bpp_00);
      for (padded_1._4_4_ = 0; padded_1._4_4_ != 7; padded_1._4_4_ = padded_1._4_4_ + 1) {
        if (bpp_00 < 8) {
          out_00 = (uchar *)lodepng_malloc(passstart[(ulong)(padded_1._4_4_ + 1) + 7] -
                                           passstart[(ulong)padded_1._4_4_ + 7]);
          if (out_00 == (uchar *)0x0) {
            padded._0_4_ = 0x53;
            break;
          }
          addPaddingBits(out_00,puVar1 + passstart[(ulong)padded_1._4_4_ - 1],
                         (ulong)(passh[(ulong)padded_1._4_4_ + 6] * bpp_00 + 7 & 0xfffffff8),
                         (ulong)(passh[(ulong)padded_1._4_4_ + 6] * bpp_00),
                         passh[(ulong)padded_1._4_4_ - 2]);
          padded._0_4_ = filter(*out + padded_passstart[(ulong)padded_1._4_4_ + 7],out_00,
                                passh[(ulong)padded_1._4_4_ + 6],passh[(ulong)padded_1._4_4_ - 2],
                                &info_png->color,settings);
          lodepng_free(out_00);
        }
        else {
          padded._0_4_ = filter(*out + padded_passstart[(ulong)padded_1._4_4_ + 7],
                                puVar1 + passstart[(ulong)padded_1._4_4_ + 7],
                                passh[(ulong)padded_1._4_4_ + 6],passh[(ulong)padded_1._4_4_ - 2],
                                &info_png->color,settings);
        }
        if ((uint)padded != 0) break;
      }
    }
    lodepng_free(puVar1);
  }
  return (uint)padded;
}

Assistant:

static unsigned preProcessScanlines(unsigned char** out, size_t* outsize, const unsigned char* in,
                                    unsigned w, unsigned h,
                                    const LodePNGInfo* info_png, const LodePNGEncoderSettings* settings)
{
  /*
  This function converts the pure 2D image with the PNG's colortype, into filtered-padded-interlaced data. Steps:
  *) if no Adam7: 1) add padding bits (= posible extra bits per scanline if bpp < 8) 2) filter
  *) if adam7: 1) Adam7_interlace 2) 7x add padding bits 3) 7x filter
  */
  unsigned bpp = lodepng_get_bpp(&info_png->color);
  unsigned error = 0;

  if(info_png->interlace_method == 0)
  {
    *outsize = h + (h * ((w * bpp + 7) / 8)); /*image size plus an extra byte per scanline + possible padding bits*/
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!(*out) && (*outsize)) error = 83; /*alloc fail*/

    if(!error)
    {
      /*non multiple of 8 bits per scanline, padding bits needed per scanline*/
      if(bpp < 8 && w * bpp != ((w * bpp + 7) / 8) * 8)
      {
        unsigned char* padded = (unsigned char*)lodepng_malloc(h * ((w * bpp + 7) / 8));
        if(!padded) error = 83; /*alloc fail*/
        if(!error)
        {
          addPaddingBits(padded, in, ((w * bpp + 7) / 8) * 8, w * bpp, h);
          error = filter(*out, padded, w, h, &info_png->color, settings);
        }
        lodepng_free(padded);
      }
      else
      {
        /*we can immediately filter into the out buffer, no other steps needed*/
        error = filter(*out, in, w, h, &info_png->color, settings);
      }
    }
  }
  else /*interlace_method is 1 (Adam7)*/
  {
    unsigned passw[7], passh[7];
    size_t filter_passstart[8], padded_passstart[8], passstart[8];
    unsigned char* adam7;

    Adam7_getpassvalues(passw, passh, filter_passstart, padded_passstart, passstart, w, h, bpp);

    *outsize = filter_passstart[7]; /*image size plus an extra byte per scanline + possible padding bits*/
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!(*out)) error = 83; /*alloc fail*/

    adam7 = (unsigned char*)lodepng_malloc(passstart[7]);
    if(!adam7 && passstart[7]) error = 83; /*alloc fail*/

    if(!error)
    {
      unsigned i;

      Adam7_interlace(adam7, in, w, h, bpp);
      for(i = 0; i != 7; ++i)
      {
        if(bpp < 8)
        {
          unsigned char* padded = (unsigned char*)lodepng_malloc(padded_passstart[i + 1] - padded_passstart[i]);
          if(!padded) ERROR_BREAK(83); /*alloc fail*/
          addPaddingBits(padded, &adam7[passstart[i]],
                         ((passw[i] * bpp + 7) / 8) * 8, passw[i] * bpp, passh[i]);
          error = filter(&(*out)[filter_passstart[i]], padded,
                         passw[i], passh[i], &info_png->color, settings);
          lodepng_free(padded);
        }
        else
        {
          error = filter(&(*out)[filter_passstart[i]], &adam7[padded_passstart[i]],
                         passw[i], passh[i], &info_png->color, settings);
        }

        if(error) break;
      }
    }

    lodepng_free(adam7);
  }

  return error;
}